

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status __thiscall
google::protobuf::anon_unknown_21::ValidateExtension
          (anon_unknown_21 *this,Descriptor *feature_set,FieldDescriptor *extension)

{
  bool bVar1;
  int iVar2;
  Descriptor *pDVar3;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  basic_string_view<char,_std::char_traits<char>_> args_1_01;
  basic_string_view<char,_std::char_traits<char>_> args_1_02;
  basic_string_view<char,_std::char_traits<char>_> args_1_03;
  string_view sVar4;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> args_3;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  FieldDescriptor *extension_local;
  Descriptor *feature_set_local;
  
  if (extension == (FieldDescriptor *)0x0) {
    sVar4 = Descriptor::full_name(feature_set);
    local_30 = (char *)sVar4._M_len;
    local_28 = sVar4._M_str;
    args_1._M_str = local_30;
    args_1._M_len = (size_t)"Unknown extension of ";
    (anonymous_namespace)::
    Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
              ((char *)this,args_1,local_28);
  }
  else {
    pDVar3 = FieldDescriptor::containing_type(extension);
    if (pDVar3 == feature_set) {
      pDVar3 = FieldDescriptor::message_type(extension);
      if (pDVar3 == (Descriptor *)0x0) {
        sVar4 = FieldDescriptor::full_name(extension);
        local_60 = (char *)sVar4._M_len;
        local_58 = sVar4._M_str;
        args_1_01._M_str = local_60;
        args_1_01._M_len = (size_t)"FeatureSet extension ";
        (anonymous_namespace)::
        Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                  ((char *)this,args_1_01,local_58);
      }
      else {
        bVar1 = FieldDescriptor::is_repeated(extension);
        if (bVar1) {
          sVar4 = FieldDescriptor::full_name(extension);
          local_70 = (char *)sVar4._M_len;
          args_1_02._M_str = local_70;
          args_1_02._M_len =
               (size_t)"Only singular features extensions are supported.  Found repeated extension "
          ;
          (anonymous_namespace)::
          Error<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                    ((char *)this,args_1_02);
        }
        else {
          pDVar3 = FieldDescriptor::message_type(extension);
          iVar2 = Descriptor::extension_count(pDVar3);
          if (iVar2 < 1) {
            pDVar3 = FieldDescriptor::message_type(extension);
            iVar2 = Descriptor::extension_range_count(pDVar3);
            if (iVar2 < 1) {
              absl::lts_20250127::OkStatus();
              return (Status)(uintptr_t)this;
            }
          }
          sVar4 = FieldDescriptor::full_name(extension);
          local_80 = (char *)sVar4._M_len;
          local_78 = sVar4._M_str;
          args_1_03._M_str = local_80;
          args_1_03._M_len = (size_t)"Nested extensions in feature extension ";
          (anonymous_namespace)::
          Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                    ((char *)this,args_1_03,local_78);
        }
      }
    }
    else {
      sVar4 = FieldDescriptor::full_name(extension);
      sVar5 = Descriptor::full_name(feature_set);
      local_40 = (char *)sVar4._M_len;
      local_38 = sVar4._M_str;
      local_50 = (char *)sVar5._M_len;
      args_1_00._M_str = local_40;
      args_1_00._M_len = (size_t)"Extension ";
      args_3._M_str = ".";
      args_3._M_len = (size_t)" is not an extension of ";
      (anonymous_namespace)::
      Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                ((char *)this,args_1_00,local_38,args_3,local_50);
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateExtension(const Descriptor& feature_set,
                               const FieldDescriptor* extension) {
  if (extension == nullptr) {
    return Error("Unknown extension of ", feature_set.full_name(), ".");
  }

  if (extension->containing_type() != &feature_set) {
    return Error("Extension ", extension->full_name(),
                 " is not an extension of ", feature_set.full_name(), ".");
  }

  if (extension->message_type() == nullptr) {
    return Error("FeatureSet extension ", extension->full_name(),
                 " is not of message type.  Feature extensions should "
                 "always use messages to allow for evolution.");
  }

  if (extension->is_repeated()) {
    return Error(
        "Only singular features extensions are supported.  Found "
        "repeated extension ",
        extension->full_name());
  }

  if (extension->message_type()->extension_count() > 0 ||
      extension->message_type()->extension_range_count() > 0) {
    return Error("Nested extensions in feature extension ",
                 extension->full_name(), " are not supported.");
  }

  return absl::OkStatus();
}